

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

int is_supported_universal_type(int tag,int aclass)

{
  undefined1 local_15;
  int aclass_local;
  int tag_local;
  
  if (aclass == 0) {
    local_15 = true;
    if (((((((tag != 6) && (local_15 = true, tag != 5)) && (local_15 = true, tag != 1)) &&
          (((local_15 = true, tag != 3 && (local_15 = true, tag != 2)) &&
           ((local_15 = true, tag != 10 &&
            ((local_15 = true, tag != 4 && (local_15 = true, tag != 0x12)))))))) &&
         ((local_15 = true, tag != 0x13 &&
          (((local_15 = true, tag != 0x14 && (local_15 = true, tag != 0x15)) &&
           (local_15 = true, tag != 0x16)))))) &&
        (((local_15 = true, tag != 0x17 && (local_15 = true, tag != 0x18)) &&
         (((local_15 = true, tag != 0x19 &&
           ((local_15 = true, tag != 0x1a && (local_15 = true, tag != 0x1b)))) &&
          (local_15 = true, tag != 0x1c)))))) &&
       (((local_15 = true, tag != 0x1e && (local_15 = true, tag != 0xc)) &&
        (local_15 = true, tag != 0x11)))) {
      local_15 = tag == 0x10;
    }
    aclass_local = (int)local_15;
  }
  else {
    aclass_local = 0;
  }
  return aclass_local;
}

Assistant:

static int is_supported_universal_type(int tag, int aclass) {
  if (aclass != V_ASN1_UNIVERSAL) {
    return 0;
  }
  return tag == V_ASN1_OBJECT || tag == V_ASN1_NULL || tag == V_ASN1_BOOLEAN ||
         tag == V_ASN1_BIT_STRING || tag == V_ASN1_INTEGER ||
         tag == V_ASN1_ENUMERATED || tag == V_ASN1_OCTET_STRING ||
         tag == V_ASN1_NUMERICSTRING || tag == V_ASN1_PRINTABLESTRING ||
         tag == V_ASN1_T61STRING || tag == V_ASN1_VIDEOTEXSTRING ||
         tag == V_ASN1_IA5STRING || tag == V_ASN1_UTCTIME ||
         tag == V_ASN1_GENERALIZEDTIME || tag == V_ASN1_GRAPHICSTRING ||
         tag == V_ASN1_VISIBLESTRING || tag == V_ASN1_GENERALSTRING ||
         tag == V_ASN1_UNIVERSALSTRING || tag == V_ASN1_BMPSTRING ||
         tag == V_ASN1_UTF8STRING || tag == V_ASN1_SET ||
         tag == V_ASN1_SEQUENCE;
}